

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

char * EncodeObservation(pyhanabi_observation_encoder_t *encoder,pyhanabi_observation_t *observation
                        )

{
  vector<int,_std::allocator<int>_> *this;
  vector<int,_std::allocator<int>_> *pvVar1;
  reference pvVar2;
  size_type sVar3;
  char *pcVar4;
  long *in_RSI;
  long *in_RDI;
  int i;
  string obs_str;
  vector<int,_std::allocator<int>_> encoding;
  HanabiObservation *obs;
  ObservationEncoder *obs_enc;
  char *local_88;
  int local_70;
  allocator local_59;
  string local_58 [32];
  vector<int,_std::allocator<int>_> local_38;
  long local_20;
  long *local_18;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("encoder != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x363,
                  "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
                 );
  }
  if (*in_RDI == 0) {
    __assert_fail("encoder->encoder != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x364,
                  "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
                 );
  }
  if (in_RSI == (long *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x365,
                  "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
                 );
  }
  if (*in_RSI != 0) {
    local_18 = (long *)*in_RDI;
    local_20 = *in_RSI;
    (**(code **)(*local_18 + 0x18))(&local_38,local_18,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_70 = 0;
    while( true ) {
      this = (vector<int,_std::allocator<int>_> *)(long)local_70;
      pvVar1 = (vector<int,_std::allocator<int>_> *)
               std::vector<int,_std::allocator<int>_>::size(&local_38);
      if (pvVar1 <= this) break;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_70);
      if (*pvVar2 == 0) {
        local_88 = "0";
      }
      else {
        local_88 = "1";
      }
      std::__cxx11::string::operator+=(local_58,local_88);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_38);
      if ((long)local_70 != sVar3 - 1) {
        std::__cxx11::string::operator+=(local_58,",");
      }
      local_70 = local_70 + 1;
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar4 = strdup(pcVar4);
    std::__cxx11::string::~string(local_58);
    std::vector<int,_std::allocator<int>_>::~vector(this);
    return pcVar4;
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x366,
                "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
               );
}

Assistant:

char* EncodeObservation(pyhanabi_observation_encoder_t* encoder,
                        pyhanabi_observation_t* observation) {
  REQUIRE(encoder != nullptr);
  REQUIRE(encoder->encoder != nullptr);
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  auto obs_enc = reinterpret_cast<hanabi_learning_env::ObservationEncoder*>(
      encoder->encoder);
  auto obs = reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
      observation->observation);
  std::vector<int> encoding = obs_enc->Encode(*obs);
  std::string obs_str = "";
  for (int i = 0; i < encoding.size(); i++) {
    obs_str += (encoding[i] ? "1" : "0");
    if (i != encoding.size() - 1) {
      obs_str += ",";
    }
  }
  return strdup(obs_str.c_str());
}